

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aspa_array.c
# Opt level: O0

void test_insert(void)

{
  long lVar1;
  aspa_status aVar2;
  long in_FS_OFFSET;
  aspa_record *old_pointer;
  aspa_record record_3;
  aspa_record record_2;
  aspa_record record_1;
  aspa_record record_4;
  aspa_array *array;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  aVar2 = aspa_array_create((aspa_array **)&record_4.provider_asns);
  if (aVar2 != ASPA_SUCCESS) {
    __assert_fail("aspa_array_create(&array) == ASPA_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa_array.c"
                  ,0x3f,"void test_insert(void)");
  }
  record_4.provider_asns[2] = 2;
  record_4.provider_asns[3] = 0;
  lVar1 = *(long *)(record_4.provider_asns + 4);
  record_1.provider_asns._0_4_ = 4;
  record_4.customer_asn = 3;
  record_4._4_4_ = 0;
  local_1c = 600;
  local_18 = 0x259;
  local_14 = 0x25a;
  record_4.provider_count = (size_t)&local_1c;
  aVar2 = aspa_array_insert((aspa_array *)record_4.provider_asns,0,
                            (aspa_record *)&record_1.provider_asns,true);
  if (aVar2 != ASPA_SUCCESS) {
    __assert_fail("aspa_array_insert(array, 0, &record_4, true) == ASPA_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa_array.c"
                  ,0x45,"void test_insert(void)");
  }
  record_2.provider_asns._0_4_ = 1;
  record_1.customer_asn = 3;
  record_1._4_4_ = 0;
  local_28 = 300;
  local_24 = 0x12d;
  local_20 = 0x12e;
  record_1.provider_count = (size_t)&local_28;
  aVar2 = aspa_array_insert((aspa_array *)record_4.provider_asns,1,
                            (aspa_record *)&record_2.provider_asns,true);
  if (aVar2 != ASPA_SUCCESS) {
    __assert_fail("aspa_array_insert(array, 1, &record_1, true) == ASPA_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa_array.c"
                  ,0x49,"void test_insert(void)");
  }
  record_3.provider_asns._0_4_ = 2;
  record_2.customer_asn = 3;
  record_2._4_4_ = 0;
  local_34 = 400;
  local_30 = 0x191;
  local_2c = 0x192;
  record_2.provider_count = (size_t)&local_34;
  aVar2 = aspa_array_insert((aspa_array *)record_4.provider_asns,1,
                            (aspa_record *)&record_3.provider_asns,true);
  if (aVar2 != ASPA_SUCCESS) {
    __assert_fail("aspa_array_insert(array, 1, &record_2, true) == ASPA_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa_array.c"
                  ,0x4e,"void test_insert(void)");
  }
  old_pointer._0_4_ = 3;
  record_3.customer_asn = 3;
  record_3._4_4_ = 0;
  array._0_4_ = 500;
  array._4_4_ = 0x1f5;
  local_38 = 0x1f6;
  record_3.provider_count = (size_t)&array;
  aVar2 = aspa_array_insert((aspa_array *)record_4.provider_asns,3,(aspa_record *)&old_pointer,true)
  ;
  if (aVar2 != ASPA_SUCCESS) {
    __assert_fail("aspa_array_insert(array, 3, &record_3, true) == ASPA_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa_array.c"
                  ,0x52,"void test_insert(void)");
  }
  if (lVar1 != *(long *)(record_4.provider_asns + 4)) {
    __assert_fail("old_pointer == array->data",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa_array.c"
                  ,0x54,"void test_insert(void)");
  }
  if (*(ulong *)(record_4.provider_asns + 2) < 4) {
    __assert_fail("array->capacity >= 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa_array.c"
                  ,0x55,"void test_insert(void)");
  }
  if (*record_4.provider_asns == 4) {
    if (**(int **)(record_4.provider_asns + 4) != 4) {
      __assert_fail("array->data[0].customer_asn == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa_array.c"
                    ,0x58,"void test_insert(void)");
    }
    if (*(int *)(*(long *)(record_4.provider_asns + 4) + 0x18) != 2) {
      __assert_fail("array->data[1].customer_asn == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa_array.c"
                    ,0x59,"void test_insert(void)");
    }
    if (*(int *)(*(long *)(record_4.provider_asns + 4) + 0x30) != 1) {
      __assert_fail("array->data[2].customer_asn == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa_array.c"
                    ,0x5a,"void test_insert(void)");
    }
    if (*(int *)(*(long *)(record_4.provider_asns + 4) + 0x48) == 3) {
      aspa_array_free((aspa_array *)record_4.provider_asns,true);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        return;
      }
      __stack_chk_fail();
    }
    __assert_fail("array->data[3].customer_asn == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa_array.c"
                  ,0x5b,"void test_insert(void)");
  }
  __assert_fail("array->size == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/tests/test_aspa_array.c"
                ,0x56,"void test_insert(void)");
}

Assistant:

static void test_insert(void)
{
	struct aspa_array *array;

	assert(aspa_array_create(&array) == ASPA_SUCCESS);
	array->capacity = 2;
	struct aspa_record *old_pointer = array->data;

	struct aspa_record record_4 = RECORD(4, SEEDED_ASNS(600));

	assert(aspa_array_insert(array, 0, &record_4, true) == ASPA_SUCCESS);

	struct aspa_record record_1 = RECORD(1, SEEDED_ASNS(300));

	assert(aspa_array_insert(array, 1, &record_1, true) == ASPA_SUCCESS);

	struct aspa_record record_2 = RECORD(2, SEEDED_ASNS(400));

	// Verify shifting works
	assert(aspa_array_insert(array, 1, &record_2, true) == ASPA_SUCCESS);

	struct aspa_record record_3 = RECORD(3, SEEDED_ASNS(500));

	assert(aspa_array_insert(array, 3, &record_3, true) == ASPA_SUCCESS);

	assert(old_pointer == array->data);
	assert(array->capacity >= 4);
	assert(array->size == 4);

	assert(array->data[0].customer_asn == 4);
	assert(array->data[1].customer_asn == 2);
	assert(array->data[2].customer_asn == 1);
	assert(array->data[3].customer_asn == 3);

	aspa_array_free(array, true);
}